

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *this,
          GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *old)

{
  long lVar1;
  bool bVar2;
  pair<QPersistentModelIndex,_unsigned_int> *ppVar3;
  QGenericArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *in_stack_ffffffffffffff70;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *in_stack_ffffffffffffff78;
  QGenericArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_> *in_stack_ffffffffffffff80;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                 &DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (ppVar3 = data((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                      &stack0xffffffffffffffe0),
       ppVar3 == (pair<QPersistentModelIndex,_unsigned_int> *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_0083a1ea;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                  operator->((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x83a0f7);
        begin((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x83a106);
        QtPrivate::QGenericArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::copyAppend
                  (this_00,(pair<QPersistentModelIndex,_unsigned_int> *)in_stack_ffffffffffffff78,
                   (pair<QPersistentModelIndex,_unsigned_int> *)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
             operator->((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                        &stack0xffffffffffffffe0);
        ppVar3 = begin((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                       0x83a141);
        begin((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x83a150);
        QtPrivate::QGenericArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::moveAppend
                  (in_stack_ffffffffffffff80,ppVar3,
                   (pair<QPersistentModelIndex,_unsigned_int> *)in_stack_ffffffffffffff70);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::reallocate
              ((QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
               in_stack_ffffffffffffff78,(qsizetype)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0083a1ea:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }